

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_checkpoint.cpp
# Opt level: O1

void ConcurrentCheckpoint::NopUpdate(DuckDB *db)

{
  pointer *__ptr;
  char *__end;
  long lVar1;
  Connection con;
  long *local_88;
  long *local_80;
  long *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  Connection local_50 [32];
  
  duckdb::Connection::Connection(local_50,db);
  lVar1 = 10;
  do {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"BEGIN TRANSACTION","");
    duckdb::Connection::Query((string *)&local_78);
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
    local_78 = (long *)0x0;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"UPDATE accounts SET money = money","");
    duckdb::Connection::Query((string *)&local_80);
    if (local_80 != (long *)0x0) {
      (**(code **)(*local_80 + 8))();
    }
    local_80 = (long *)0x0;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"COMMIT","");
    duckdb::Connection::Query((string *)&local_88);
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
    local_88 = (long *)0x0;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    lVar1 = lVar1 + -1;
  } while (lVar1 != 0);
  LOCK();
  finished_threads.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       ((long)finished_threads.super___atomic_base<unsigned_long>._M_i + 1);
  UNLOCK();
  if (finished_threads.super___atomic_base<unsigned_long>._M_i == 10) {
    LOCK();
    finished._M_base._M_i = (__atomic_base<bool>)true;
    UNLOCK();
  }
  duckdb::Connection::~Connection(local_50);
  return;
}

Assistant:

static void NopUpdate(DuckDB *db) {
		Connection con(*db);
		for (size_t i = 0; i < 10; i++) {
			con.Query("BEGIN TRANSACTION");
			con.Query("UPDATE accounts SET money = money");
			con.Query("COMMIT");
		}
		finished_threads++;
		if (finished_threads == CONCURRENT_UPDATE_TOTAL_ACCOUNTS) {
			finished = true;
		}
	}